

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioaWriteAig.c
# Opt level: O1

char * Ioa_WriteAigerIntoMemory(Aig_Man_t *pMan,int *pnSize)

{
  char cVar1;
  uint uVar2;
  int iVar3;
  Vec_Str_t *__ptr;
  char *pcVar4;
  char *pcVar5;
  ulong uVar6;
  size_t sVar7;
  size_t __size;
  
  __ptr = Ioa_WriteAigerIntoMemoryStr(pMan);
  if (pMan->pName == (char *)0x0) goto LAB_00746031;
  uVar2 = __ptr->nCap;
  if (__ptr->nSize == uVar2) {
    if ((int)uVar2 < 0x10) {
      if (__ptr->pArray == (char *)0x0) {
        pcVar4 = (char *)malloc(0x10);
      }
      else {
        pcVar4 = (char *)realloc(__ptr->pArray,0x10);
      }
      sVar7 = 0x10;
    }
    else {
      sVar7 = (ulong)uVar2 * 2;
      if ((int)sVar7 <= (int)uVar2) goto LAB_00745eee;
      if (__ptr->pArray == (char *)0x0) {
        pcVar4 = (char *)malloc(sVar7);
      }
      else {
        pcVar4 = (char *)realloc(__ptr->pArray,sVar7);
      }
    }
    __ptr->pArray = pcVar4;
    __ptr->nCap = (int)sVar7;
  }
LAB_00745eee:
  iVar3 = __ptr->nSize;
  __ptr->nSize = iVar3 + 1;
  __ptr->pArray[iVar3] = 'n';
  pcVar4 = pMan->pName;
  sVar7 = strlen(pcVar4);
  if (0 < (int)(uint)sVar7) {
    uVar6 = 0;
    do {
      cVar1 = pcVar4[uVar6];
      uVar2 = __ptr->nCap;
      if (__ptr->nSize == uVar2) {
        if ((int)uVar2 < 0x10) {
          if (__ptr->pArray == (char *)0x0) {
            pcVar5 = (char *)malloc(0x10);
          }
          else {
            pcVar5 = (char *)realloc(__ptr->pArray,0x10);
          }
          __size = 0x10;
        }
        else {
          __size = (ulong)uVar2 * 2;
          if ((int)__size <= (int)uVar2) goto LAB_00745f81;
          if (__ptr->pArray == (char *)0x0) {
            pcVar5 = (char *)malloc(__size);
          }
          else {
            pcVar5 = (char *)realloc(__ptr->pArray,__size);
          }
        }
        __ptr->pArray = pcVar5;
        __ptr->nCap = (int)__size;
      }
LAB_00745f81:
      iVar3 = __ptr->nSize;
      __ptr->nSize = iVar3 + 1;
      __ptr->pArray[iVar3] = cVar1;
      uVar6 = uVar6 + 1;
    } while (((uint)sVar7 & 0x7fffffff) != uVar6);
  }
  uVar2 = __ptr->nCap;
  if (__ptr->nSize == uVar2) {
    if ((int)uVar2 < 0x10) {
      if (__ptr->pArray == (char *)0x0) {
        pcVar4 = (char *)malloc(0x10);
      }
      else {
        pcVar4 = (char *)realloc(__ptr->pArray,0x10);
      }
      __ptr->pArray = pcVar4;
      sVar7 = 0x10;
    }
    else {
      sVar7 = (ulong)uVar2 * 2;
      if ((int)sVar7 <= (int)uVar2) goto LAB_0074601f;
      if (__ptr->pArray == (char *)0x0) {
        pcVar4 = (char *)malloc(sVar7);
      }
      else {
        pcVar4 = (char *)realloc(__ptr->pArray,sVar7);
      }
      __ptr->pArray = pcVar4;
    }
    __ptr->nCap = (int)sVar7;
  }
LAB_0074601f:
  iVar3 = __ptr->nSize;
  __ptr->nSize = iVar3 + 1;
  __ptr->pArray[iVar3] = '\0';
LAB_00746031:
  *pnSize = __ptr->nSize;
  pcVar4 = __ptr->pArray;
  __ptr->nCap = 0;
  __ptr->nSize = 0;
  __ptr->pArray = (char *)0x0;
  if (__ptr->pArray != (char *)0x0) {
    free(__ptr->pArray);
    __ptr->pArray = (char *)0x0;
  }
  if (__ptr != (Vec_Str_t *)0x0) {
    free(__ptr);
  }
  return pcVar4;
}

Assistant:

char * Ioa_WriteAigerIntoMemory( Aig_Man_t * pMan, int * pnSize )
{
    char * pBuffer;
    Vec_Str_t * vBuffer;
    vBuffer = Ioa_WriteAigerIntoMemoryStr( pMan );
    if ( pMan->pName )
    {
        Vec_StrPrintStr( vBuffer, "n" );
        Vec_StrPrintStr( vBuffer, pMan->pName );
        Vec_StrPush( vBuffer, 0 );
    }
    // prepare the return values
    *pnSize = Vec_StrSize( vBuffer );
    pBuffer = Vec_StrReleaseArray( vBuffer );
    Vec_StrFree( vBuffer );
    return pBuffer;
}